

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

int __thiscall
LPCMStreamReader::writeAdditionData
          (LPCMStreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  uint32_t uVar1;
  VodCoreException *this_00;
  uint local_25c;
  char c_1;
  char *__end3_1;
  char *__begin3_1;
  char (*__range3_1) [9];
  uint16_t bitsPerSample;
  WAVEFORMATPCMEX *waveFormatPCMEx;
  uint32_t *fmtSize;
  char c;
  char *__end3;
  char *__begin3;
  char (*__range3) [17];
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream ss;
  uint8_t *local_38;
  uint8_t *curPos;
  PriorityDataInfo *priorityData_local;
  AVPacket *avPacket_local;
  uint8_t *dstEnd_local;
  uint8_t *dstBuffer_local;
  LPCMStreamReader *this_local;
  
  local_38 = dstBuffer;
  if ((((this->super_SimplePacketizerReader).super_AbstractStreamReader.m_demuxMode & 1U) != 0) &&
     ((this->m_firstFrame & 1U) != 0)) {
    if ((uint)((int)dstEnd - (int)dstBuffer) < 0x30) {
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      std::operator<<((ostream *)local_1b0,
                      "LPCM stream error: Not enough buffer for writing headers");
      this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_00,3,&local_1e0);
      __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    local_38 = dstBuffer;
    for (__end3 = anon_var_dwarf_c2696; __end3 != anon_var_dwarf_c26a1; __end3 = __end3 + 1) {
      *local_38 = *__end3;
      local_38 = local_38 + 1;
    }
    local_38[-1] = '(';
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = 0xfe;
    local_38[4] = 0xff;
    *(ushort *)(local_38 + 5) = (ushort)this->m_channels;
    *(int32_t *)(local_38 + 7) = this->m_freq;
    *(uint *)(local_38 + 0xb) =
         (uint)this->m_channels * this->m_freq * ((int)(this->m_bitsPerSample + 4) >> 3);
    if (this->m_bitsPerSample == 0x14) {
      local_25c = 0x18;
    }
    else {
      local_25c = (uint)this->m_bitsPerSample;
    }
    *(short *)(local_38 + 0xf) = (short)((ulong)(this->m_channels * local_25c) / 8);
    *(short *)(local_38 + 0x11) = (short)local_25c;
    local_38[0x13] = '\x16';
    local_38[0x14] = '\0';
    *(uint16_t *)(local_38 + 0x15) = this->m_bitsPerSample;
    uVar1 = wave_format::getWaveChannelMask((uint)this->m_channels,(bool)(this->m_lfeExists & 1));
    *(uint32_t *)(local_38 + 0x17) = uVar1;
    *(undefined8 *)(local_38 + 0x1b) = wave_format::KSDATAFORMAT_SUBTYPE_PCM;
    *(undefined8 *)(local_38 + 0x23) = DAT_00449540;
    local_38 = local_38 + 0x2b;
    for (__end3_1 = anon_var_dwarf_c26a1; __end3_1 != "m_curPos <= m_bufEnd";
        __end3_1 = __end3_1 + 1) {
      *local_38 = *__end3_1;
      local_38 = local_38 + 1;
    }
    local_38 = local_38 + -1;
  }
  this->m_firstFrame = false;
  return (int)local_38 - (int)dstBuffer;
}

Assistant:

int LPCMStreamReader::writeAdditionData(uint8_t* dstBuffer, uint8_t* dstEnd, AVPacket& avPacket,
                                        PriorityDataInfo* priorityData)
{
    uint8_t* curPos = dstBuffer;
    if (m_demuxMode)
    {
        if (m_firstFrame)
        {
            if (static_cast<unsigned>(dstEnd - dstBuffer) < sizeof(WAVEFORMATPCMEX) + 8)
                THROW(ERR_COMMON, "LPCM stream error: Not enough buffer for writing headers")
            // write wave header
            for (const char c : "RIFF\xff\xff\xff\xffWAVEfmt ") *curPos++ = c;
            curPos--;
            const auto fmtSize = reinterpret_cast<uint32_t*>(curPos);
            *fmtSize = sizeof(WAVEFORMATPCMEX);
            curPos += 4;
            const auto waveFormatPCMEx = reinterpret_cast<WAVEFORMATPCMEX*>(curPos);
            waveFormatPCMEx->wFormatTag = WAVE_FORMAT_EXTENSIBLE;
            waveFormatPCMEx->nChannels = m_channels;
            waveFormatPCMEx->nSamplesPerSec = m_freq;
            waveFormatPCMEx->nAvgBytesPerSec = m_channels * m_freq * ((m_bitsPerSample + 4) >> 3);
            const uint16_t bitsPerSample = m_bitsPerSample == 20 ? 24 : m_bitsPerSample;
            waveFormatPCMEx->nBlockAlign = m_channels * bitsPerSample / 8;
            waveFormatPCMEx->wBitsPerSample = bitsPerSample;
            waveFormatPCMEx->cbSize = 22;  // After this to GUID
            waveFormatPCMEx->Samples.wValidBitsPerSample = m_bitsPerSample;
            waveFormatPCMEx->dwChannelMask = getWaveChannelMask(m_channels, m_lfeExists);  // Specify PCM
            waveFormatPCMEx->SubFormat = KSDATAFORMAT_SUBTYPE_PCM;
            curPos += sizeof(WAVEFORMATPCMEX);
            for (const char c : "data\xff\xff\xff\xff") *curPos++ = c;
            curPos--;
        }
    }
    /*
    if (m_headerType == htM2TS) {
            m_firstFrame = false;
            return curPos - dstBuffer; // frames already has right LPCM headers
    }
    */
    m_firstFrame = false;
    return static_cast<int>(curPos - dstBuffer);
}